

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.cpp
# Opt level: O3

void __thiscall CControls::ClampMousePos(CControls *this)

{
  vec2 vVar1;
  CGameClient *pCVar2;
  float fVar3;
  float fVar4;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar6;
  undefined1 auVar5 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pCVar2 = (this->super_CComponent).m_pClient;
  if (((pCVar2->m_Snap).m_SpecInfo.m_Active == true) &&
     ((pCVar2->m_Snap).m_SpecInfo.m_UsePosition == false)) {
    fVar4 = (float)((pCVar2->m_Collision).m_Width << 5) + -200.0;
    fVar3 = (this->m_MousePos).field_0.x;
    fVar7 = (this->m_MousePos).field_1.y;
    if (fVar3 <= fVar4) {
      fVar4 = fVar3;
    }
    (this->m_MousePos).field_0 =
         (anon_union_4_2_94730284_for_vector2_base<float>_1)
         (-(uint)(fVar3 < 200.0) & 0x43480000 | ~-(uint)(fVar3 < 200.0) & (uint)fVar4);
    fVar3 = (float)((pCVar2->m_Collision).m_Height << 5) + -200.0;
    if (fVar7 <= fVar3) {
      fVar3 = fVar7;
    }
    (this->m_MousePos).field_1 =
         (anon_union_4_2_947302a4_for_vector2_base<float>_3)
         (-(uint)(fVar7 < 200.0) & 0x43480000 | ~-(uint)(fVar7 < 200.0) & (uint)fVar3);
  }
  else {
    fVar3 = GetMaxMouseDistance(this);
    vVar1 = this->m_MousePos;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = vVar1.field_0;
    auVar5._4_4_ = vVar1.field_1;
    aVar6 = vVar1.field_1;
    fVar7 = vVar1.field_0.x * vVar1.field_0.x + aVar6.y * aVar6.y;
    if (fVar3 * fVar3 < fVar7) {
      auVar8._0_4_ = SQRT(fVar7);
      auVar9._4_4_ = aVar6;
      auVar9._0_4_ = auVar8._0_4_;
      auVar9._8_4_ = aVar6;
      auVar9._12_4_ = aVar6;
      auVar8._8_8_ = auVar9._8_8_;
      auVar8._4_4_ = auVar8._0_4_;
      auVar5 = divps(auVar5,auVar8);
      vVar1.field_1.y = fVar3 * auVar5._4_4_;
      vVar1.field_0.x = fVar3 * auVar5._0_4_;
      this->m_MousePos = vVar1;
    }
  }
  return;
}

Assistant:

void CControls::ClampMousePos()
{
	if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition)
	{
		m_MousePos.x = clamp(m_MousePos.x, 200.0f, Collision()->GetWidth()*32-200.0f);
		m_MousePos.y = clamp(m_MousePos.y, 200.0f, Collision()->GetHeight()*32-200.0f);
	}
	else
	{
		const float MouseMax = GetMaxMouseDistance();
		if(dot(m_MousePos, m_MousePos) > MouseMax * MouseMax)
			m_MousePos = normalize(m_MousePos) * MouseMax;
	}
}